

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_getFileInfo(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  err_frame_t *peVar3;
  CVmException *pCVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  vm_datatype_t vVar7;
  uint uVar8;
  uint uVar9;
  undefined4 uVar10;
  CVmNetFile *this_00;
  undefined8 *puVar11;
  long *plVar12;
  size_t srclen;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  os_file_stat_t stat;
  vm_rcdesc rc;
  err_frame_t err_cur__;
  
  if (oargc == (uint *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = *oargc;
  }
  if ((getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar5 = __cxa_guard_acquire(&getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar5 != 0)) {
    getp_getFileInfo::desc.min_argc_ = 0;
    getp_getFileInfo::desc.opt_argc_ = 0;
    getp_getFileInfo::desc.varargs_ = 0;
    __cxa_guard_release(&getp_getFileInfo(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFileInfo::desc);
  if (iVar5 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"FileName.getFileInfo");
    this_00 = CVmObjFile::get_filename_from_obj(self,&rc,0x1001,0xb,"application/octet-stream");
    if (uVar13 == 0) {
      uVar8 = 1;
    }
    else {
      if (sp_[-1].typ - VM_STACK < 0xfffffffe) {
        err_throw(0x902);
      }
      uVar8 = (uint)(sp_[-1].typ == VM_TRUE);
    }
    puVar11 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar11;
    plVar12 = (long *)_ZTW11G_err_frame();
    *plVar12 = (long)&err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      iVar5 = CVmNetFile::get_file_stat(this_00,&stat,uVar8);
      uVar8 = (uint)(iVar5 == 0);
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    peVar3 = err_cur__.prv_;
    puVar11 = (undefined8 *)_ZTW11G_err_frame();
    *puVar11 = peVar3;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar11 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar11 & 2) != 0) {
        plVar12 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar12 + 0x10));
      }
      pCVar4 = err_cur__.exc_;
      plVar12 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar12 + 0x10) = pCVar4;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    pvVar2 = sp_;
    if (uVar8 == 0) {
      uVar14 = 0;
      uVar15 = uVar14;
      for (; uVar14 != 0x40; uVar14 = uVar14 + 0x10) {
        if ((*(ulong *)((long)&map_file_attrs(unsigned_long)::xlat + uVar14) & stat.attrs) != 0) {
          uVar15 = (ulong)((uint)uVar15 | *(uint *)((long)&DAT_002b2848 + uVar14));
        }
      }
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_INT;
      (pvVar2->val).obj = (uint)uVar15;
      if ((((uint)stat.mode & 0xa000) == 0) ||
         (iVar5 = CVmNetFile::resolve_symlink(this_00,(char *)&err_cur__,0x1000), pvVar2 = sp_,
         iVar5 == 0)) {
        pvVar1 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar1 = VM_NIL;
      }
      else {
        sp_ = sp_ + 1;
        srclen = strlen((char *)&err_cur__);
        vVar6 = CVmObjString::create(0,(char *)&err_cur__,srclen,G_cmap_from_fname_X);
        pvVar2->typ = VM_OBJ;
        (pvVar2->val).obj = vVar6;
      }
      push_file_time(stat.acc_time);
      push_file_time(stat.mod_time);
      push_file_time(stat.cre_time);
      if ((int)stat.sizelo < 0 || stat.sizehi != 0) {
        stat.sizelo = CVmObjBigNum::create_int64(0,stat.sizehi,stat.sizelo);
        vVar7 = VM_OBJ;
      }
      else {
        vVar7 = VM_INT;
      }
      pvVar2 = sp_;
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = vVar7;
      (pvVar2->val).obj = stat.sizelo;
      uVar8 = filemode_to_filetype((uint)stat.mode);
      uVar9 = special_filetype_flags(this);
      pvVar2 = sp_;
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_INT;
      (pvVar2->val).obj = uVar9 | uVar8;
      if (G_predef_X.file_info == 0) {
        uVar10 = CVmObjList::create_from_stack((uchar **)0x0,7);
      }
      else {
        (**(code **)(*(long *)&G_obj_table_X.pages_[G_predef_X.file_info >> 0xc]
                               [G_predef_X.file_info & 0xfff].ptr_ + 0x18))
                  (G_obj_table_X.pages_[G_predef_X.file_info >> 0xc] +
                   (G_predef_X.file_info & 0xfff),G_predef_X.file_info,0,7);
        uVar10 = r0_.val.obj;
        if (r0_.typ != VM_OBJ) {
          err_throw(0x7da);
        }
      }
      retval->typ = VM_OBJ;
      (retval->val).obj = uVar10;
    }
    else {
      retval->typ = VM_NIL;
    }
    sp_ = sp_ + -(long)(int)uVar13;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getFileInfo(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the GETINFO access mode */
    vm_rcdesc rc(vmg_ "FileName.getFileInfo",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_GETFILEINFO, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_GETINFO,
        OSFTUNK, "application/octet-stream");

    /* check to see if we're following links (follow them by default) */
    int follow_links = TRUE;
    if (argc >= 1)
    {
        /* 
         *   note that our 'asLink' parameter has the opposite sense from
         *   'follow_links', so invert the parameter value 
         */
        follow_links = G_stk->get(0)->get_logical();
        if (!G_stk->get(0)->is_logical())
            err_throw(VMERR_BAD_VAL_BIF);
    }

    int ok;
    os_file_stat_t stat;
    err_try
    {
        /* get the file type from the netfile object */
        ok = netfile->get_file_stat(vmg_ &stat, follow_links);
    }